

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

bool __thiscall RDNSequence::Decode(RDNSequence *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  DecodeResult DVar2;
  size_t sVar3;
  uchar *pIn_00;
  size_t *cbUsed_00;
  undefined1 local_98 [8];
  RelativeDistinguishedName rdn;
  size_t item;
  undefined1 local_58 [8];
  SequenceHelper sh;
  size_t *cbUsed_local;
  size_t cbIn_local;
  uchar *pIn_local;
  RDNSequence *this_local;
  
  sh._32_8_ = cbUsed;
  SequenceHelper::SequenceHelper((SequenceHelper *)local_58,cbUsed);
  DVar2 = SequenceHelper::Init((SequenceHelper *)local_58,pIn,cbIn,&(this->super_DerBase).cbData);
  if (DVar2 == Failed) {
    this_local._7_1_ = 0;
  }
  else if (DVar2 - Null < 2) {
    this_local._7_1_ = 1;
  }
  else {
    rdn.attrs.super__Vector_base<AttributeTypeAndValue,_std::allocator<AttributeTypeAndValue>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while (sVar3 = SequenceHelper::DataSize((SequenceHelper *)local_58), sVar3 != 0) {
      RelativeDistinguishedName::RelativeDistinguishedName((RelativeDistinguishedName *)local_98);
      pIn_00 = SequenceHelper::DataPtr((SequenceHelper *)local_58,pIn);
      sVar3 = SequenceHelper::DataSize((SequenceHelper *)local_58);
      cbUsed_00 = SequenceHelper::CurrentSize((SequenceHelper *)local_58);
      bVar1 = RelativeDistinguishedName::Decode
                        ((RelativeDistinguishedName *)local_98,pIn_00,sVar3,cbUsed_00);
      if (bVar1) {
        std::vector<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>::
        push_back(&this->name,(value_type *)local_98);
        SequenceHelper::Update((SequenceHelper *)local_58);
      }
      else {
        this_local._7_1_ = 0;
      }
      RelativeDistinguishedName::~RelativeDistinguishedName((RelativeDistinguishedName *)local_98);
      if (!bVar1) goto LAB_0011de12;
      rdn.attrs.super__Vector_base<AttributeTypeAndValue,_std::allocator<AttributeTypeAndValue>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&((rdn.attrs.
                              super__Vector_base<AttributeTypeAndValue,_std::allocator<AttributeTypeAndValue>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_DerBase).
                            _vptr_DerBase + 1);
    }
    this_local._7_1_ = 1;
  }
LAB_0011de12:
  SequenceHelper::~SequenceHelper((SequenceHelper *)local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

virtual bool Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed) override
	{
        SequenceHelper sh(cbUsed);

        switch (sh.Init(pIn, cbIn, this->cbData))
        {
        case DecodeResult::Failed:
            return false;
        case DecodeResult::Null:
        case DecodeResult::EmptySequence:
            return true;
        case DecodeResult::Success:
            break;
        }

        // This is a sequence of sets of AttributeTypeAndValue
        for (size_t item = 0; sh.DataSize() > 0; ++item)
        {
            RelativeDistinguishedName rdn;
            if (!rdn.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
                return false;

            name.push_back(rdn);
            sh.Update();
        }

        return true;
	}